

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_List.h
# Opt level: O0

void __thiscall
axl::sl::
OwningListBase<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>,_axl::sl::Iterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>,_axl::mem::Delete<Point2d>_>
::clear(OwningListBase<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>,_axl::sl::Iterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>,_axl::mem::Delete<Point2d>_>
        *this)

{
  Delete<Point2d> *in_RDI;
  Point2d *p;
  ListLink *link;
  Point2d *in_stack_ffffffffffffffc8;
  Entry *in_stack_ffffffffffffffe0;
  ImplicitPtrCast<Point2d,_axl::sl::ListLink> local_11;
  ListLink *local_10;
  
  if (*(long *)in_RDI != 0) {
    local_10 = ImplicitPtrCast<Point2d,_axl::sl::ListLink>::operator()
                         (&local_11,*(Point2d **)in_RDI);
    while (local_10 != (ListLink *)0x0) {
      in_stack_ffffffffffffffe0 =
           IteratorBase<axl::sl::Iterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>,_Point2d,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>
           ::getEntryFromLink(&in_stack_ffffffffffffffe0->super_ListLink);
      local_10 = ListLink::getNext(local_10);
      mem::Delete<Point2d>::operator()(in_RDI,in_stack_ffffffffffffffc8);
    }
    ListBase<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>,_axl::sl::Iterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>_>
    ::construct((ListBase<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>,_axl::sl::Iterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>_>
                 *)in_RDI);
  }
  return;
}

Assistant:

void
	clear() {
		if (!this->m_head)
			return;

		ListLink* link = GetLink()(this->m_head);
		while (link) {
			T* p = Iterator::getEntryFromLink(link);
			link = link->getNext();
			Delete()(p);
		}

		this->construct();
	}